

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

bool __thiscall
lzham::symbol_codec::encode(symbol_codec *this,uint sym,adaptive_arith_data_model *model)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint *in_RDX;
  uint in_ESI;
  uint bit;
  uint bitmask;
  uint node;
  uint i;
  undefined4 in_stack_ffffffffffffffe8;
  
  i = 1;
  uVar2 = *in_RDX;
  do {
    uVar2 = uVar2 >> 1;
    uVar3 = in_ESI & uVar2;
    vector<lzham::adaptive_bit_model>::operator[]
              ((vector<lzham::adaptive_bit_model> *)(in_RDX + 2),i);
    bVar1 = encode((symbol_codec *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                   (uint)((ulong)in_RDX >> 0x20),(adaptive_bit_model *)CONCAT44(i,uVar2),false);
    if (!bVar1) {
      return false;
    }
    i = i * 2 + (uint)(uVar3 != 0);
  } while (1 < uVar2);
  return true;
}

Assistant:

bool symbol_codec::encode(uint sym, adaptive_arith_data_model& model)
   {
      uint node = 1;

      uint bitmask = model.m_total_syms;

      do
      {
         bitmask >>= 1;

         uint bit = (sym & bitmask) ? 1 : 0;
         if (!encode(bit, model.m_probs[node]))
            return false;
         node = (node << 1) + bit;

      } while (bitmask > 1);
      return true;
   }